

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

void __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *inlinedFrame,
          JavascriptCallStackLayout *layout,bool boxValues)

{
  ulong uVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  Var aValue;
  ScriptFunction *this_00;
  FunctionBody *pFVar9;
  undefined4 extraout_var;
  InlineeCallInfo aValue_00;
  RecyclableObject *ptr;
  FunctionInfo *pFVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (this->inlineDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd3,"(this->inlineDepth != 0)","this->inlineDepth != 0");
    if (!bVar4) goto LAB_0055a83d;
    *puVar8 = 0;
  }
  if (this->inlineeStartOffset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd4,"(inlineeStartOffset != 0)","inlineeStartOffset != 0");
    if (!bVar4) goto LAB_0055a83d;
    *puVar8 = 0;
  }
  if (DAT_015bc46a == '\x01') {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0055a83d;
      *puVar8 = 0;
      pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar10->functionId);
    if (bVar4) {
      Output::Print(L"Restore function object: ");
    }
  }
  aValue = Restore(this,this->functionOffset,false,false,layout,functionBody,boxValues);
  bVar4 = Js::VarIs<Js::ScriptFunction>(aValue);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd9,"(Js::VarIs<Js::ScriptFunction>(varFunction))",
                       "Js::VarIs<Js::ScriptFunction>(varFunction)");
    if (!bVar4) goto LAB_0055a83d;
    *puVar8 = 0;
  }
  this_00 = Js::VarTo<Js::ScriptFunction>(aValue);
  if (DAT_015bc46a == '\x01') {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0055a83d;
      *puVar8 = 0;
      pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar10->functionId);
    if (bVar4) {
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      iVar6 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar9);
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      pFVar10 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar10 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_0055a83d;
        *puVar8 = 0;
        pFVar10 = (pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      Output::Print(L"Inlinee: %s [%d.%d] \n",CONCAT44(extraout_var,iVar6),(ulong)uVar5,
                    (ulong)pFVar10->functionId);
    }
  }
  inlinedFrame->function = (JavascriptFunction *)this_00;
  (inlinedFrame->callInfo).InlineeStartOffset = this->inlineeStartOffset;
  uVar7 = this->argCount & 0xf;
  *(uint *)&inlinedFrame->callInfo = *(uint *)&inlinedFrame->callInfo & 0xfffffff0 | uVar7;
  if (uVar7 != 0) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar12 = 0;
    do {
      BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
      uVar1 = (this->floatArgs).word;
      uVar11 = 1L << ((byte)uVar12 & 0x3f);
      BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar12);
      uVar2 = (this->losslessInt32Args).word;
      if (DAT_015bc46a == '\x01') {
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar10 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_0055a83d;
          *puVar8 = 0;
          pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
          ;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar10->functionId);
        if (bVar4) {
          Output::Print(L"Restore argument %d: ",uVar12 & 0xffffffff);
        }
      }
      aValue_00 = (InlineeCallInfo)
                  Restore(this,this->argOffsets[uVar12],(uVar1 & uVar11) != 0,(uVar2 & uVar11) != 0,
                          layout,functionBody,boxValues);
      if (boxValues) {
        bVar4 = Js::VarIs<Js::RecyclableObject>((Var)aValue_00);
        if (bVar4) {
          ptr = Js::VarTo<Js::RecyclableObject>((Var)aValue_00);
          bVar4 = ThreadContext::IsOnStack(ptr);
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                               ,0xed,"(!ThreadContext::IsOnStack(recyclableObject))",
                               "!ThreadContext::IsOnStack(recyclableObject)");
            if (!bVar4) goto LAB_0055a83d;
            *puVar8 = 0;
          }
        }
      }
      (&inlinedFrame[1].callInfo)[uVar12] = aValue_00;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (*(uint *)&inlinedFrame->callInfo & 0xf));
  }
  inlinedFrame->arguments = (Var)0x0;
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0055a83d;
    *puVar8 = 0;
    pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,BailOutPhase,uVar5,pFVar10->functionId);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar10 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_0055a83d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      pFVar10 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar5,pFVar10->functionId);
    if (!bVar4) {
      return;
    }
  }
  Output::Flush();
  return;
}

Assistant:

void InlineeFrameRecord::Restore(Js::FunctionBody* functionBody, InlinedFrameLayout *inlinedFrame, Js::JavascriptCallStackLayout * layout, bool boxValues) const
{
    Assert(this->inlineDepth != 0);
    Assert(inlineeStartOffset != 0);

    BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore function object: "));
    // No deepCopy needed for just the function
    Js::Var varFunction = this->Restore(this->functionOffset, /*isFloat64*/ false, /*isInt32*/ false, layout, functionBody, boxValues);
    Assert(Js::VarIs<Js::ScriptFunction>(varFunction));

    Js::ScriptFunction* function = Js::VarTo<Js::ScriptFunction>(varFunction);
    BAILOUT_VERBOSE_TRACE(functionBody, _u("Inlinee: %s [%d.%d] \n"), function->GetFunctionBody()->GetDisplayName(), function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetLocalFunctionId());

    inlinedFrame->function = function;
    inlinedFrame->callInfo.InlineeStartOffset = inlineeStartOffset;
    inlinedFrame->callInfo.Count = this->argCount;
    inlinedFrame->MapArgs([=](uint i, Js::Var* varRef) {
        bool isFloat64 = floatArgs.Test(i) != 0;
        bool isInt32 = losslessInt32Args.Test(i) != 0;
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore argument %d: "), i);

        // Forward deepCopy flag for the arguments in case their data must be guaranteed
        // to have its own lifetime
        Js::Var var = this->Restore(this->argOffsets[i], isFloat64, isInt32, layout, functionBody, boxValues);
#if DBG
        if (boxValues && !Js::TaggedNumber::Is(var))
        {
            Js::RecyclableObject *const recyclableObject = Js::VarTo<Js::RecyclableObject>(var);
            Assert(!ThreadContext::IsOnStack(recyclableObject));
        }
#endif
        *varRef = var;
    });
    inlinedFrame->arguments = nullptr;
    BAILOUT_FLUSH(functionBody);
}